

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O2

void highbd_blend_a64_d16_mask_w16_sse4_1
               (uint16_t *dst,CONV_BUF_TYPE *src0,CONV_BUF_TYPE *src1,__m128i *round_offset,
               int shift,__m128i *mask0l,__m128i *mask0h,__m128i *clip_low,__m128i *clip_high,
               __m128i *mask_max)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i alVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  unkbyte10 Var24;
  unkbyte10 Var25;
  unkbyte10 Var26;
  unkbyte10 Var27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  ushort uVar32;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ushort uVar42;
  ushort uVar44;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  undefined1 auVar46 [16];
  ushort uVar53;
  undefined1 auVar55 [16];
  int iVar56;
  int iVar59;
  undefined1 auVar62 [16];
  int iVar63;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar70;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  undefined1 (*in_stack_00000008) [16];
  short sVar33;
  short sVar43;
  short sVar45;
  short sVar54;
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar60 [12];
  undefined1 auVar61 [16];
  undefined1 auVar64 [12];
  undefined1 auVar65 [16];
  undefined1 auVar74 [12];
  undefined1 auVar75 [16];
  
  auVar46 = *(undefined1 (*) [16])src0;
  auVar35 = *(undefined1 (*) [16])(src0 + 8);
  auVar1 = *(undefined1 (*) [16])src1;
  auVar62 = *(undefined1 (*) [16])(src1 + 8);
  sVar70 = (short)(*clip_high)[0];
  sVar54 = *(short *)((long)*clip_high + 2);
  sVar4 = *(short *)((long)*clip_high + 4);
  sVar5 = *(short *)((long)*clip_high + 6);
  sVar6 = (short)(*clip_high)[1];
  sVar7 = *(short *)((long)*clip_high + 10);
  sVar8 = *(short *)((long)*clip_high + 0xc);
  sVar9 = *(short *)((long)*clip_high + 0xe);
  auVar2 = *in_stack_00000008;
  auVar34._0_2_ = sVar70 - auVar2._0_2_;
  auVar34._2_2_ = sVar54 - auVar2._2_2_;
  auVar34._4_2_ = sVar4 - auVar2._4_2_;
  auVar34._6_2_ = sVar5 - auVar2._6_2_;
  auVar34._8_2_ = sVar6 - auVar2._8_2_;
  auVar34._10_2_ = sVar7 - auVar2._10_2_;
  auVar34._12_2_ = sVar8 - auVar2._12_2_;
  auVar34._14_2_ = sVar9 - auVar2._14_2_;
  alVar3 = *mask0l;
  auVar55._0_2_ = sVar70 - (short)alVar3[0];
  auVar55._2_2_ = sVar54 - alVar3[0]._2_2_;
  auVar55._4_2_ = sVar4 - alVar3[0]._4_2_;
  auVar55._6_2_ = sVar5 - alVar3[0]._6_2_;
  auVar55._8_2_ = sVar6 - (short)alVar3[1];
  auVar55._10_2_ = sVar7 - alVar3[1]._2_2_;
  auVar55._12_2_ = sVar8 - alVar3[1]._4_2_;
  auVar55._14_2_ = sVar9 - alVar3[1]._6_2_;
  auVar71 = pmulhuw(auVar2,auVar35);
  sVar70 = auVar2._6_2_ * auVar35._6_2_;
  iVar73 = CONCAT22(auVar71._8_2_,auVar2._8_2_ * auVar35._8_2_);
  auVar74._0_8_ = CONCAT26(auVar71._10_2_,CONCAT24(auVar2._10_2_ * auVar35._10_2_,iVar73));
  auVar74._8_2_ = auVar2._12_2_ * auVar35._12_2_;
  auVar74._10_2_ = auVar71._12_2_;
  auVar75._12_2_ = auVar2._14_2_ * auVar35._14_2_;
  auVar75._0_12_ = auVar74;
  auVar75._14_2_ = auVar71._14_2_;
  iVar28 = CONCAT22(auVar71._6_2_,sVar70);
  Var24 = CONCAT64(CONCAT42(iVar28,auVar71._4_2_),CONCAT22(auVar2._4_2_ * auVar35._4_2_,sVar70));
  auVar20._4_8_ = (long)((unkuint10)Var24 >> 0x10);
  auVar20._2_2_ = auVar71._2_2_;
  auVar20._0_2_ = auVar2._2_2_ * auVar35._2_2_;
  auVar72 = pmulhuw(auVar34,auVar62);
  sVar70 = auVar34._6_2_ * auVar62._6_2_;
  iVar63 = CONCAT22(auVar72._8_2_,auVar34._8_2_ * auVar62._8_2_);
  auVar64._0_8_ = CONCAT26(auVar72._10_2_,CONCAT24(auVar34._10_2_ * auVar62._10_2_,iVar63));
  auVar64._8_2_ = auVar34._12_2_ * auVar62._12_2_;
  auVar64._10_2_ = auVar72._12_2_;
  auVar65._12_2_ = auVar34._14_2_ * auVar62._14_2_;
  auVar65._0_12_ = auVar64;
  auVar65._14_2_ = auVar72._14_2_;
  iVar29 = CONCAT22(auVar72._6_2_,sVar70);
  Var25 = CONCAT64(CONCAT42(iVar29,auVar72._4_2_),CONCAT22(auVar34._4_2_ * auVar62._4_2_,sVar70));
  auVar21._4_8_ = (long)((unkuint10)Var25 >> 0x10);
  auVar21._2_2_ = auVar72._2_2_;
  auVar21._0_2_ = auVar34._2_2_ * auVar62._2_2_;
  auVar67 = pmulhuw((undefined1  [16])alVar3,auVar46);
  sVar70 = alVar3[0]._6_2_ * auVar46._6_2_;
  iVar59 = CONCAT22(auVar67._8_2_,(short)alVar3[1] * auVar46._8_2_);
  auVar60._0_8_ = CONCAT26(auVar67._10_2_,CONCAT24(alVar3[1]._2_2_ * auVar46._10_2_,iVar59));
  auVar60._8_2_ = alVar3[1]._4_2_ * auVar46._12_2_;
  auVar60._10_2_ = auVar67._12_2_;
  auVar61._12_2_ = alVar3[1]._6_2_ * auVar46._14_2_;
  auVar61._0_12_ = auVar60;
  auVar61._14_2_ = auVar67._14_2_;
  iVar30 = CONCAT22(auVar67._6_2_,sVar70);
  Var26 = CONCAT64(CONCAT42(iVar30,auVar67._4_2_),CONCAT22(alVar3[0]._4_2_ * auVar46._4_2_,sVar70));
  auVar22._4_8_ = (long)((unkuint10)Var26 >> 0x10);
  auVar22._2_2_ = auVar67._2_2_;
  auVar22._0_2_ = alVar3[0]._2_2_ * auVar46._2_2_;
  auVar68 = pmulhuw(auVar55,auVar1);
  sVar70 = auVar55._6_2_ * auVar1._6_2_;
  iVar56 = CONCAT22(auVar68._8_2_,auVar55._8_2_ * auVar1._8_2_);
  auVar57._0_8_ = CONCAT26(auVar68._10_2_,CONCAT24(auVar55._10_2_ * auVar1._10_2_,iVar56));
  auVar57._8_2_ = auVar55._12_2_ * auVar1._12_2_;
  auVar57._10_2_ = auVar68._12_2_;
  auVar58._12_2_ = auVar55._14_2_ * auVar1._14_2_;
  auVar58._0_12_ = auVar57;
  auVar58._14_2_ = auVar68._14_2_;
  iVar31 = CONCAT22(auVar68._6_2_,sVar70);
  Var27 = CONCAT64(CONCAT42(iVar31,auVar68._4_2_),CONCAT22(auVar55._4_2_ * auVar1._4_2_,sVar70));
  auVar23._4_8_ = (long)((unkuint10)Var27 >> 0x10);
  auVar23._2_2_ = auVar68._2_2_;
  auVar23._0_2_ = auVar55._2_2_ * auVar1._2_2_;
  iVar10 = (int)(*round_offset)[0];
  iVar11 = *(int *)((long)*round_offset + 4);
  iVar12 = (int)(*round_offset)[1];
  iVar13 = *(int *)((long)*round_offset + 0xc);
  auVar69 = ZEXT416((uint)shift);
  auVar66._0_4_ = (iVar63 + iVar73) - iVar10 >> auVar69;
  auVar66._4_4_ =
       ((int)((ulong)auVar64._0_8_ >> 0x20) + (int)((ulong)auVar74._0_8_ >> 0x20)) - iVar11 >>
       auVar69;
  auVar66._8_4_ = (auVar64._8_4_ + auVar74._8_4_) - iVar12 >> auVar69;
  auVar66._12_4_ = (auVar65._12_4_ + auVar75._12_4_) - iVar13 >> auVar69;
  auVar35._0_4_ =
       (CONCAT22(auVar72._0_2_,auVar34._0_2_ * auVar62._0_2_) +
       CONCAT22(auVar71._0_2_,auVar2._0_2_ * auVar35._0_2_)) - iVar10 >> auVar69;
  auVar35._4_4_ = (auVar21._0_4_ + auVar20._0_4_) - iVar11 >> auVar69;
  auVar35._8_4_ =
       ((int)((unkuint10)Var25 >> 0x10) + (int)((unkuint10)Var24 >> 0x10)) - iVar12 >> auVar69;
  auVar35._12_4_ = (iVar29 + iVar28) - iVar13 >> auVar69;
  auVar35 = packssdw(auVar35,auVar66);
  auVar62._0_4_ = (iVar59 - iVar10) + iVar56 >> auVar69;
  auVar62._4_4_ =
       ((int)((ulong)auVar60._0_8_ >> 0x20) - iVar11) + (int)((ulong)auVar57._0_8_ >> 0x20) >>
       auVar69;
  auVar62._8_4_ = (auVar60._8_4_ - iVar12) + auVar57._8_4_ >> auVar69;
  auVar62._12_4_ = (auVar61._12_4_ - iVar13) + auVar58._12_4_ >> auVar69;
  auVar46._0_4_ =
       (CONCAT22(auVar67._0_2_,(short)alVar3[0] * auVar46._0_2_) - iVar10) +
       CONCAT22(auVar68._0_2_,auVar55._0_2_ * auVar1._0_2_) >> auVar69;
  auVar46._4_4_ = (auVar22._0_4_ - iVar11) + auVar23._0_4_ >> auVar69;
  auVar46._8_4_ =
       ((int)((unkuint10)Var26 >> 0x10) - iVar12) + (int)((unkuint10)Var27 >> 0x10) >> auVar69;
  auVar46._12_4_ = (iVar30 - iVar13) + iVar31 >> auVar69;
  auVar46 = packssdw(auVar46,auVar62);
  sVar70 = (short)(*mask0h)[0];
  sVar54 = *(short *)((long)*mask0h + 2);
  sVar4 = *(short *)((long)*mask0h + 4);
  sVar5 = *(short *)((long)*mask0h + 6);
  sVar6 = (short)(*mask0h)[1];
  sVar7 = *(short *)((long)*mask0h + 10);
  sVar8 = *(short *)((long)*mask0h + 0xc);
  sVar9 = *(short *)((long)*mask0h + 0xe);
  sVar33 = auVar35._0_2_;
  uVar32 = (ushort)(sVar33 < sVar70) * sVar70 | (ushort)(sVar33 >= sVar70) * sVar33;
  sVar33 = auVar35._2_2_;
  uVar36 = (ushort)(sVar33 < sVar54) * sVar54 | (ushort)(sVar33 >= sVar54) * sVar33;
  sVar33 = auVar35._4_2_;
  uVar37 = (ushort)(sVar33 < sVar4) * sVar4 | (ushort)(sVar33 >= sVar4) * sVar33;
  sVar33 = auVar35._6_2_;
  uVar38 = (ushort)(sVar33 < sVar5) * sVar5 | (ushort)(sVar33 >= sVar5) * sVar33;
  sVar33 = auVar35._8_2_;
  uVar39 = (ushort)(sVar33 < sVar6) * sVar6 | (ushort)(sVar33 >= sVar6) * sVar33;
  sVar33 = auVar35._10_2_;
  uVar40 = (ushort)(sVar33 < sVar7) * sVar7 | (ushort)(sVar33 >= sVar7) * sVar33;
  sVar33 = auVar35._12_2_;
  sVar43 = auVar35._14_2_;
  uVar41 = (ushort)(sVar33 < sVar8) * sVar8 | (ushort)(sVar33 >= sVar8) * sVar33;
  uVar42 = (ushort)(sVar43 < sVar9) * sVar9 | (ushort)(sVar43 >= sVar9) * sVar43;
  sVar33 = (short)(*clip_low)[0];
  sVar43 = *(short *)((long)*clip_low + 2);
  sVar14 = *(short *)((long)*clip_low + 4);
  sVar15 = *(short *)((long)*clip_low + 6);
  sVar16 = (short)(*clip_low)[1];
  sVar17 = *(short *)((long)*clip_low + 10);
  sVar18 = *(short *)((long)*clip_low + 0xc);
  sVar19 = *(short *)((long)*clip_low + 0xe);
  sVar45 = auVar46._0_2_;
  uVar44 = (ushort)(sVar45 < sVar70) * sVar70 | (ushort)(sVar45 >= sVar70) * sVar45;
  sVar70 = auVar46._2_2_;
  uVar47 = (ushort)(sVar70 < sVar54) * sVar54 | (ushort)(sVar70 >= sVar54) * sVar70;
  sVar70 = auVar46._4_2_;
  uVar48 = (ushort)(sVar70 < sVar4) * sVar4 | (ushort)(sVar70 >= sVar4) * sVar70;
  sVar70 = auVar46._6_2_;
  uVar49 = (ushort)(sVar70 < sVar5) * sVar5 | (ushort)(sVar70 >= sVar5) * sVar70;
  sVar70 = auVar46._8_2_;
  uVar50 = (ushort)(sVar70 < sVar6) * sVar6 | (ushort)(sVar70 >= sVar6) * sVar70;
  sVar70 = auVar46._10_2_;
  uVar51 = (ushort)(sVar70 < sVar7) * sVar7 | (ushort)(sVar70 >= sVar7) * sVar70;
  sVar70 = auVar46._12_2_;
  sVar54 = auVar46._14_2_;
  uVar52 = (ushort)(sVar70 < sVar8) * sVar8 | (ushort)(sVar70 >= sVar8) * sVar70;
  uVar53 = (ushort)(sVar54 < sVar9) * sVar9 | (ushort)(sVar54 >= sVar9) * sVar54;
  *dst = (ushort)(sVar33 < (short)uVar44) * sVar33 | (sVar33 >= (short)uVar44) * uVar44;
  dst[1] = (ushort)(sVar43 < (short)uVar47) * sVar43 | (sVar43 >= (short)uVar47) * uVar47;
  dst[2] = (ushort)(sVar14 < (short)uVar48) * sVar14 | (sVar14 >= (short)uVar48) * uVar48;
  dst[3] = (ushort)(sVar15 < (short)uVar49) * sVar15 | (sVar15 >= (short)uVar49) * uVar49;
  dst[4] = (ushort)(sVar16 < (short)uVar50) * sVar16 | (sVar16 >= (short)uVar50) * uVar50;
  dst[5] = (ushort)(sVar17 < (short)uVar51) * sVar17 | (sVar17 >= (short)uVar51) * uVar51;
  dst[6] = (ushort)(sVar18 < (short)uVar52) * sVar18 | (sVar18 >= (short)uVar52) * uVar52;
  dst[7] = (ushort)(sVar19 < (short)uVar53) * sVar19 | (sVar19 >= (short)uVar53) * uVar53;
  dst[8] = (ushort)(sVar33 < (short)uVar32) * sVar33 | (sVar33 >= (short)uVar32) * uVar32;
  dst[9] = (ushort)(sVar43 < (short)uVar36) * sVar43 | (sVar43 >= (short)uVar36) * uVar36;
  dst[10] = (ushort)(sVar14 < (short)uVar37) * sVar14 | (sVar14 >= (short)uVar37) * uVar37;
  dst[0xb] = (ushort)(sVar15 < (short)uVar38) * sVar15 | (sVar15 >= (short)uVar38) * uVar38;
  dst[0xc] = (ushort)(sVar16 < (short)uVar39) * sVar16 | (sVar16 >= (short)uVar39) * uVar39;
  dst[0xd] = (ushort)(sVar17 < (short)uVar40) * sVar17 | (sVar17 >= (short)uVar40) * uVar40;
  dst[0xe] = (ushort)(sVar18 < (short)uVar41) * sVar18 | (sVar18 >= (short)uVar41) * uVar41;
  dst[0xf] = (ushort)(sVar19 < (short)uVar42) * sVar19 | (sVar19 >= (short)uVar42) * uVar42;
  return;
}

Assistant:

static inline void highbd_blend_a64_d16_mask_w16_sse4_1(
    uint16_t *dst, const CONV_BUF_TYPE *src0, const CONV_BUF_TYPE *src1,
    const __m128i *round_offset, int shift, const __m128i *mask0l,
    const __m128i *mask0h, const __m128i *clip_low, const __m128i *clip_high,
    const __m128i *mask_max) {
  // Load 16x u16 pixels for this row from each src
  const __m128i s0l = xx_loadu_128(src0);
  const __m128i s0h = xx_loadu_128(src0 + 8);
  const __m128i s1l = xx_loadu_128(src1);
  const __m128i s1h = xx_loadu_128(src1 + 8);

  // Calculate inverse masks
  const __m128i mask1h = _mm_sub_epi16(*mask_max, *mask0h);
  const __m128i mask1l = _mm_sub_epi16(*mask_max, *mask0l);

  const __m128i mul0_highs = _mm_mulhi_epu16(*mask0h, s0h);
  const __m128i mul0_lows = _mm_mullo_epi16(*mask0h, s0h);
  const __m128i mul0h = _mm_unpackhi_epi16(mul0_lows, mul0_highs);
  const __m128i mul0l = _mm_unpacklo_epi16(mul0_lows, mul0_highs);

  const __m128i mul1_highs = _mm_mulhi_epu16(mask1h, s1h);
  const __m128i mul1_lows = _mm_mullo_epi16(mask1h, s1h);
  const __m128i mul1h = _mm_unpackhi_epi16(mul1_lows, mul1_highs);
  const __m128i mul1l = _mm_unpacklo_epi16(mul1_lows, mul1_highs);

  const __m128i mulhh = _mm_add_epi32(mul0h, mul1h);
  const __m128i mulhl = _mm_add_epi32(mul0l, mul1l);

  const __m128i mul2_highs = _mm_mulhi_epu16(*mask0l, s0l);
  const __m128i mul2_lows = _mm_mullo_epi16(*mask0l, s0l);
  const __m128i mul2h = _mm_unpackhi_epi16(mul2_lows, mul2_highs);
  const __m128i mul2l = _mm_unpacklo_epi16(mul2_lows, mul2_highs);

  const __m128i mul3_highs = _mm_mulhi_epu16(mask1l, s1l);
  const __m128i mul3_lows = _mm_mullo_epi16(mask1l, s1l);
  const __m128i mul3h = _mm_unpackhi_epi16(mul3_lows, mul3_highs);
  const __m128i mul3l = _mm_unpacklo_epi16(mul3_lows, mul3_highs);

  const __m128i mullh = _mm_add_epi32(mul2h, mul3h);
  const __m128i mulll = _mm_add_epi32(mul2l, mul3l);

  const __m128i reshh =
      _mm_srai_epi32(_mm_sub_epi32(mulhh, *round_offset), shift);
  const __m128i reshl =
      _mm_srai_epi32(_mm_sub_epi32(mulhl, *round_offset), shift);
  const __m128i reslh =
      _mm_srai_epi32(_mm_sub_epi32(mullh, *round_offset), shift);
  const __m128i resll =
      _mm_srai_epi32(_mm_sub_epi32(mulll, *round_offset), shift);

  // Signed saturating pack from i32 to i16:
  const __m128i packh = _mm_packs_epi32(reshl, reshh);
  const __m128i packl = _mm_packs_epi32(resll, reslh);

  // Clip the values to the valid range
  const __m128i cliph =
      _mm_min_epi16(_mm_max_epi16(packh, *clip_low), *clip_high);
  const __m128i clipl =
      _mm_min_epi16(_mm_max_epi16(packl, *clip_low), *clip_high);

  // Store 16 pixels
  xx_storeu_128(dst, clipl);
  xx_storeu_128(dst + 8, cliph);
}